

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbridge.c
# Opt level: O2

boolean create_drawbridge(level *lev,int x,int y,int dir,boolean flag)

{
  char cVar1;
  char cVar2;
  boolean bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  
  cVar1 = lev->locations[x][y].typ;
  switch(dir) {
  case 0:
    iVar8 = y + -1;
    break;
  case 1:
    iVar8 = y + 1;
    break;
  case 2:
    iVar7 = x + 1;
    goto LAB_0015bc93;
  default:
    impossible("bad direction in create_drawbridge");
  case 3:
    iVar7 = x + -1;
LAB_0015bc93:
    uVar4 = 0;
    uVar5 = 0x200;
    iVar8 = y;
    goto LAB_0015bc9a;
  }
  uVar4 = 0x200;
  uVar5 = 0;
  iVar7 = x;
LAB_0015bc9a:
  cVar2 = lev->locations[iVar7][iVar8].typ;
  if (cVar2 < '\r' && cVar2 != '\0') {
    if (flag == '\0') {
      lev->locations[x][y].typ = '\x14';
      lev->locations[iVar7][iVar8].typ = '\f';
      uVar6 = *(uint *)&lev->locations[iVar7][iVar8].field_0x6 & 0xfffffe0f | 0x80;
    }
    else {
      lev->locations[x][y].typ = '$';
      lev->locations[iVar7][iVar8].typ = '\x17';
      uVar6 = *(uint *)&lev->locations[iVar7][iVar8].field_0x6 & 0xfffffe0f;
    }
    *(uint *)&lev->locations[iVar7][iVar8].field_0x6 = uVar6;
    *(uint *)&lev->locations[x][y].field_0x6 =
         *(uint *)&lev->locations[x][y].field_0x6 & 0xfffffdff | uVar5;
    *(uint *)&lev->locations[iVar7][iVar8].field_0x6 =
         *(uint *)&lev->locations[iVar7][iVar8].field_0x6 & 0xfffffdff | uVar4;
    uVar4 = dir << 4 & 0x1b0U | 0x40;
    if (cVar1 != '\x15') {
      uVar4 = dir << 4 & 0x1f0;
    }
    *(uint *)&lev->locations[x][y].field_0x6 =
         uVar4 | *(uint *)&lev->locations[x][y].field_0x6 & 0xfffffe0f;
    bVar3 = '\x01';
  }
  else {
    bVar3 = '\0';
  }
  return bVar3;
}

Assistant:

boolean create_drawbridge(struct level *lev, int x, int y, int dir, boolean flag)
{
	int x2,y2;
	boolean horiz;
	boolean lava = lev->locations[x][y].typ == LAVAPOOL; /* assume initialized map */

	x2 = x; y2 = y;
	switch(dir) {
		case DB_NORTH:
			horiz = TRUE;
			y2--;
			break;
		case DB_SOUTH:
			horiz = TRUE;
			y2++;
			break;
		case DB_EAST:
			horiz = FALSE;
			x2++;
			break;
		default:
			impossible("bad direction in create_drawbridge");
			/* fall through */
		case DB_WEST:
			horiz = FALSE;
			x2--;
			break;
	}
	if (!IS_WALL(lev->locations[x2][y2].typ))
		return FALSE;
	if (flag) {             /* We want the bridge open */
		lev->locations[x][y].typ = DRAWBRIDGE_DOWN;
		lev->locations[x2][y2].typ = DOOR;
		lev->locations[x2][y2].doormask = D_NODOOR;
	} else {
		lev->locations[x][y].typ = DRAWBRIDGE_UP;
		lev->locations[x2][y2].typ = DBWALL;
		/* Drawbridges are non-diggable. */
		lev->locations[x2][y2].wall_info = W_NONDIGGABLE;
	}
	lev->locations[x][y].horizontal = !horiz;
	lev->locations[x2][y2].horizontal = horiz;
	lev->locations[x][y].drawbridgemask = dir;
	if (lava) lev->locations[x][y].drawbridgemask |= DB_LAVA;
	return TRUE;
}